

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlNodeSetPtr xmlXPathGetElementsByIds(xmlDocPtr doc,xmlChar *ids)

{
  byte *pbVar1;
  xmlNodeSetPtr cur;
  ulong uVar2;
  xmlChar *ID;
  _xmlNode *val;
  int len;
  xmlNodeSetPtr pxVar3;
  byte *pbVar4;
  
  if (ids == (xmlChar *)0x0) {
    pxVar3 = (xmlNodeSetPtr)0x0;
  }
  else {
    cur = xmlXPathNodeSetCreate((xmlNodePtr)0x0);
    pxVar3 = (xmlNodeSetPtr)0x0;
    pbVar4 = ids;
    if (cur != (xmlNodeSetPtr)0x0) {
      while ((uVar2 = (ulong)*pbVar4, uVar2 < 0x21 && ((0x100002600U >> (uVar2 & 0x3f) & 1) != 0)))
      {
        pbVar4 = pbVar4 + 1;
      }
      while (pxVar3 = cur, (char)uVar2 != '\0') {
        len = (int)pbVar4 - (int)ids;
        while ((0x20 < (byte)uVar2 || ((0x100002601U >> (uVar2 & 0x3f) & 1) == 0))) {
          pbVar1 = pbVar4 + 1;
          pbVar4 = pbVar4 + 1;
          len = len + 1;
          uVar2 = (ulong)*pbVar1;
        }
        ID = xmlStrndup(ids,len);
        if (ID != (xmlChar *)0x0) {
          val = (_xmlNode *)xmlGetID(doc,ID);
          if ((val != (xmlNodePtr)0x0) &&
             ((val->type == XML_ELEMENT_NODE ||
              ((val->type == XML_ATTRIBUTE_NODE && (val = val->parent, val != (_xmlNode *)0x0))))))
          {
            xmlXPathNodeSetAdd(cur,val);
          }
          (*xmlFree)(ID);
        }
        while ((uVar2 = (ulong)*pbVar4, ids = pbVar4, uVar2 < 0x21 &&
               ((0x100002600U >> (uVar2 & 0x3f) & 1) != 0))) {
          pbVar4 = pbVar4 + 1;
        }
      }
    }
  }
  return pxVar3;
}

Assistant:

static xmlNodeSetPtr
xmlXPathGetElementsByIds (xmlDocPtr doc, const xmlChar *ids) {
    xmlNodeSetPtr ret;
    const xmlChar *cur = ids;
    xmlChar *ID;
    xmlAttrPtr attr;
    xmlNodePtr elem = NULL;

    if (ids == NULL) return(NULL);

    ret = xmlXPathNodeSetCreate(NULL);
    if (ret == NULL)
        return(ret);

    while (IS_BLANK_CH(*cur)) cur++;
    while (*cur != 0) {
	while ((!IS_BLANK_CH(*cur)) && (*cur != 0))
	    cur++;

        ID = xmlStrndup(ids, cur - ids);
	if (ID != NULL) {
	    /*
	     * We used to check the fact that the value passed
	     * was an NCName, but this generated much troubles for
	     * me and Aleksey Sanin, people blatantly violated that
	     * constraint, like Visa3D spec.
	     * if (xmlValidateNCName(ID, 1) == 0)
	     */
	    attr = xmlGetID(doc, ID);
	    if (attr != NULL) {
		if (attr->type == XML_ATTRIBUTE_NODE)
		    elem = attr->parent;
		else if (attr->type == XML_ELEMENT_NODE)
		    elem = (xmlNodePtr) attr;
		else
		    elem = NULL;
                /* TODO: Check memory error. */
		if (elem != NULL)
		    xmlXPathNodeSetAdd(ret, elem);
	    }
	    xmlFree(ID);
	}

	while (IS_BLANK_CH(*cur)) cur++;
	ids = cur;
    }
    return(ret);
}